

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_moves(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  uint16_t uVar2;
  ushort uVar3;
  int opsize;
  int32_t arg2;
  TCGv_i32 addr;
  TCGv_i32 val;
  TCGv_i32 *ppTVar4;
  uint uVar5;
  
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  uVar2 = read_im16(env,s);
  opsize = insn_opsize((uint)insn);
  if ((short)uVar2 < 0) {
    uVar5 = uVar2 >> 0xc & 7;
    if (((uint)s->writeback_mask >> uVar5 & 1) == 0) {
      ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar4 = s->writeback;
    }
  }
  else {
    ppTVar4 = tcg_ctx->cpu_dregs;
    uVar5 = (uint)(uVar2 >> 0xc);
  }
  pTVar1 = ppTVar4[uVar5];
  addr = gen_lea(env,s,insn,opsize);
  if (addr != tcg_ctx->NULL_QREG) {
    uVar5 = ((s->base).tb)->flags;
    if ((uVar2 >> 0xb & 1) == 0) {
      val = gen_load(s,opsize,addr,0,(uint)((uVar5 >> 0xe & 1) == 0));
      if ((short)uVar2 < 0) {
        gen_ext(tcg_ctx,pTVar1,val,opsize,1);
      }
      else {
        gen_partset_reg(tcg_ctx,opsize,pTVar1,val);
      }
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    }
    else {
      gen_store(s,opsize,addr,pTVar1,(uint)(-1 < (short)uVar5));
    }
    uVar3 = insn >> 3 & 7;
    if (uVar3 != 4) {
      if (uVar3 == 3) {
        uVar5 = insn & 7;
        if (((uint)s->writeback_mask >> uVar5 & 1) == 0) {
          ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
        }
        else {
          ppTVar4 = s->writeback;
        }
        pTVar1 = ppTVar4[uVar5];
        if (uVar5 == 7 && opsize == 0) {
          arg2 = 2;
        }
        else {
          arg2 = opsize_bytes(opsize);
        }
        tcg_gen_addi_i32_m68k(tcg_ctx,pTVar1,addr,arg2);
        return;
      }
      return;
    }
    uVar5 = insn & 7;
    if (((uint)s->writeback_mask >> uVar5 & 1) == 0) {
      ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar4 = s->writeback;
    }
    tcg_gen_mov_i32(tcg_ctx,ppTVar4[uVar5],addr);
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(moves)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    uint16_t ext;
    TCGv reg;
    TCGv addr;
    int extend;

    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }

    ext = read_im16(env, s);

    opsize = insn_opsize(insn);

    if (ext & 0x8000) {
        /* address register */
        reg = AREG(ext, 12);
        extend = 1;
    } else {
        /* data register */
        reg = DREG(ext, 12);
        extend = 0;
    }

    addr = gen_lea(env, s, insn, opsize);
    if (IS_NULL_QREG(addr)) {
        gen_addr_fault(s);
        return;
    }

    if (ext & 0x0800) {
        /* from reg to ea */
        gen_store(s, opsize, addr, reg, DFC_INDEX(s));
    } else {
        /* from ea to reg */
        TCGv tmp = gen_load(s, opsize, addr, 0, SFC_INDEX(s));
        if (extend) {
            gen_ext(tcg_ctx, reg, tmp, opsize, 1);
        } else {
            gen_partset_reg(tcg_ctx, opsize, reg, tmp);
        }
        tcg_temp_free(tcg_ctx, tmp);
    }
    switch (extract32(insn, 3, 3)) {
    case 3: /* Indirect postincrement.  */
        tcg_gen_addi_i32(tcg_ctx, AREG(insn, 0), addr,
                         REG(insn, 0) == 7 && opsize == OS_BYTE
                         ? 2
                         : opsize_bytes(opsize));
        break;
    case 4: /* Indirect predecrememnt.  */
        tcg_gen_mov_i32(tcg_ctx, AREG(insn, 0), addr);
        break;
    }
}